

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

void __thiscall soplex::SPxScaler<double>::setup(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  DataArray<int> *this_00;
  int *piVar1;
  long lVar2;
  
  this_00 = &(lp->super_LPColSetBase<double>).scaleExp;
  this->m_activeColscaleExp = this_00;
  this->m_activeRowscaleExp = &(lp->super_LPRowSetBase<double>).scaleExp;
  DataArray<int>::reSize
            (this_00,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  DataArray<int>::reSize
            (this->m_activeRowscaleExp,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  if (0 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    piVar1 = this->m_activeColscaleExp->data;
    lVar2 = 0;
    do {
      piVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    piVar1 = this->m_activeRowscaleExp->data;
    lVar2 = 0;
    do {
      piVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  lp->lp_scaler = this;
  return;
}

Assistant:

void SPxScaler<R>::setup(SPxLPBase<R>& lp)
{
   assert(lp.isConsistent());
   m_activeColscaleExp = &lp.LPColSetBase<R>::scaleExp;
   m_activeRowscaleExp = &lp.LPRowSetBase<R>::scaleExp;
   m_activeColscaleExp->reSize(lp.nCols());
   m_activeRowscaleExp->reSize(lp.nRows());

   for(int i = 0; i < lp.nCols(); ++i)
      (*m_activeColscaleExp)[i] = 0;

   for(int i = 0; i < lp.nRows(); ++i)
      (*m_activeRowscaleExp)[i] = 0;

   lp.lp_scaler = this;
}